

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_avx2.c
# Opt level: O2

uint64_t aom_sum_squares_2d_i16_avx2(int16_t *src,int stride,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  uint uVar6;
  uint64_t uVar7;
  int iVar8;
  int16_t *piVar9;
  int16_t *piVar10;
  int16_t *piVar11;
  int iVar12;
  int row;
  long lVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  
  if ((width == 4) && (height == 4)) {
    uVar7 = aom_sum_squares_2d_i16_4x4_sse2(src,stride);
    return uVar7;
  }
  uVar6 = height & 3;
  if ((width == 4) && (uVar6 == 0)) {
    uVar7 = aom_sum_squares_2d_i16_4xn_sse2(src,stride,height);
    return uVar7;
  }
  if ((width == 8) && (uVar6 == 0)) {
    uVar7 = aom_sum_squares_2d_i16_nxn_sse2(src,stride,8,height);
    return uVar7;
  }
  if (uVar6 != 0 || (width & 0xfU) != 0) {
    uVar7 = aom_sum_squares_2d_i16_c(src,stride,width,height);
    return uVar7;
  }
  iVar8 = stride << 2;
  piVar9 = src + stride * 3;
  piVar10 = src + stride * 2;
  piVar11 = src + stride;
  auVar14 = ZEXT1664((undefined1  [16])0x0);
  for (iVar12 = 0; iVar12 < height; iVar12 = iVar12 + 4) {
    auVar16 = ZEXT1664((undefined1  [16])0x0);
    for (lVar13 = 0; auVar15 = auVar16._0_32_, lVar13 < width; lVar13 = lVar13 + 0x10) {
      auVar3 = vpmaddwd_avx2(*(undefined1 (*) [32])(src + lVar13),
                             *(undefined1 (*) [32])(src + lVar13));
      auVar4 = vpmaddwd_avx2(*(undefined1 (*) [32])(piVar11 + lVar13),
                             *(undefined1 (*) [32])(piVar11 + lVar13));
      auVar5 = vpmaddwd_avx2(*(undefined1 (*) [32])(piVar10 + lVar13),
                             *(undefined1 (*) [32])(piVar10 + lVar13));
      auVar4 = vpaddd_avx2(auVar4,auVar5);
      auVar5 = vpmaddwd_avx2(*(undefined1 (*) [32])(piVar9 + lVar13),
                             *(undefined1 (*) [32])(piVar9 + lVar13));
      auVar15 = vpaddd_avx2(auVar3,auVar15);
      auVar15 = vpaddd_avx2(auVar15,auVar4);
      auVar15 = vpaddd_avx2(auVar15,auVar5);
      auVar16 = ZEXT3264(auVar15);
    }
    auVar4 = vpblendd_avx2(auVar15,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
    auVar15 = vpsrlq_avx2(auVar15,0x20);
    auVar15 = vpaddq_avx2(auVar14._0_32_,auVar15);
    auVar15 = vpaddq_avx2(auVar4,auVar15);
    auVar14 = ZEXT3264(auVar15);
    piVar9 = piVar9 + iVar8;
    piVar10 = piVar10 + iVar8;
    piVar11 = piVar11 + iVar8;
    src = src + iVar8;
  }
  auVar1 = vpaddq_avx(auVar14._0_16_,auVar14._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpaddq_avx(auVar2,auVar1);
  return auVar1._0_8_;
}

Assistant:

uint64_t aom_sum_squares_2d_i16_avx2(const int16_t *src, int stride, int width,
                                     int height) {
  if (LIKELY(width == 4 && height == 4)) {
    return aom_sum_squares_2d_i16_4x4_sse2(src, stride);
  } else if (LIKELY(width == 4 && (height & 3) == 0)) {
    return aom_sum_squares_2d_i16_4xn_sse2(src, stride, height);
  } else if (LIKELY(width == 8 && (height & 3) == 0)) {
    return aom_sum_squares_2d_i16_nxn_sse2(src, stride, width, height);
  } else if (LIKELY(((width & 15) == 0) && ((height & 3) == 0))) {
    return aom_sum_squares_2d_i16_nxn_avx2(src, stride, width, height);
  } else {
    return aom_sum_squares_2d_i16_c(src, stride, width, height);
  }
}